

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LabelLengthCase::iterate(LabelLengthCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 *puVar5;
  long *plVar6;
  NotSupportedError *this_00;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  undefined8 uVar11;
  int outlen;
  ScopedLogSection section;
  ostringstream s;
  ResultCollector result;
  int local_2ac;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  string local_288;
  string local_268;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  undefined4 local_224;
  ScopedLogSection local_220;
  undefined8 local_218;
  code *local_210;
  int local_208;
  undefined1 local_200 [8];
  _func_int **local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [6];
  ios_base local_190 [8];
  ios_base local_188 [264];
  ResultCollector local_80;
  long lVar4;
  
  bVar2 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x9d8);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_200 = (undefined1  [8])local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar1,(string *)local_200);
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
  }
  local_2ac = -1;
  local_218 = (**(code **)(lVar4 + 0x640))(0x9117,0);
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 != 0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_210);
    uVar10 = 0xf;
    if (local_248 != local_238) {
      uVar10 = local_238[0];
    }
    if (uVar10 < local_268._M_string_length + local_240) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar11 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_268._M_string_length + local_240) goto LAB_013e912c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
    }
    else {
LAB_013e912c:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268._M_dataplus._M_p)
      ;
    }
    local_2a8 = &local_298;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_298 = *plVar6;
      uStack_290 = puVar5[3];
    }
    else {
      local_298 = *plVar6;
      local_2a8 = (long *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_1f0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1f0[0]._8_8_ = plVar6[3];
      local_200 = (undefined1  [8])local_1f0;
    }
    else {
      local_1f0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_200 = (undefined1  [8])*plVar6;
    }
    local_1f8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
  }
  local_224 = (**(code **)(lVar4 + 0x3f0))(0x8b30);
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 != 0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_210);
    uVar10 = 0xf;
    if (local_248 != local_238) {
      uVar10 = local_238[0];
    }
    if (uVar10 < local_268._M_string_length + local_240) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar11 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_268._M_string_length + local_240) goto LAB_013e938c;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
    }
    else {
LAB_013e938c:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268._M_dataplus._M_p)
      ;
    }
    local_2a8 = &local_298;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_298 = *plVar6;
      uStack_290 = puVar5[3];
    }
    else {
      local_298 = *plVar6;
      local_2a8 = (long *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_1f0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1f0[0]._8_8_ = plVar6[3];
      local_200 = (undefined1  [8])local_1f0;
    }
    else {
      local_1f0[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_200 = (undefined1  [8])*plVar6;
    }
    local_1f8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
  }
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_200 = (undefined1  [8])local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Shader","");
  paVar8 = &local_288.field_2;
  local_288._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Shader object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_220,pTVar1,(string *)local_200,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar8) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
  }
  local_200 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"Querying label length",0x15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  local_2ac = -1;
  (**(code **)(lVar4 + 0x958))(0x82e1,local_224,0,&local_2ac,0);
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 != 0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_210);
    uVar10 = 0xf;
    if (local_248 != local_238) {
      uVar10 = local_238[0];
    }
    if (uVar10 < local_268._M_string_length + local_240) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar11 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_268._M_string_length + local_240) goto LAB_013e96f5;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
    }
    else {
LAB_013e96f5:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268._M_dataplus._M_p)
      ;
    }
    local_2a8 = &local_298;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_298 = *plVar6;
      uStack_290 = puVar5[3];
    }
    else {
      local_298 = *plVar6;
      local_2a8 = (long *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1f0[0]._8_8_ = plVar6[3];
      local_200 = (undefined1  [8])local_1f0;
    }
    else {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_200 = (undefined1  [8])*plVar6;
    }
    local_1f8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
  }
  if (local_2ac == 0) {
    local_200 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Query returned length: ",0x17);
    std::ostream::operator<<((ostringstream *)&local_1f8,local_2ac);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,local_2ac);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x1c792d4);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
  }
  local_200 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"Setting label to string: \"",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"This is a debug label",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"\"",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  (**(code **)(lVar4 + 0xfc0))(0x82e1,local_224,0xffffffff,"This is a debug label");
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 != 0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_210);
    uVar10 = 0xf;
    if (local_248 != local_238) {
      uVar10 = local_238[0];
    }
    if (uVar10 < local_268._M_string_length + local_240) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar11 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_268._M_string_length + local_240) goto LAB_013e9b4f;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
    }
    else {
LAB_013e9b4f:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268._M_dataplus._M_p)
      ;
    }
    local_2a8 = &local_298;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_298 = *plVar6;
      uStack_290 = puVar5[3];
    }
    else {
      local_298 = *plVar6;
      local_2a8 = (long *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1f0[0]._8_8_ = plVar6[3];
      local_200 = (undefined1  [8])local_1f0;
    }
    else {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_200 = (undefined1  [8])*plVar6;
    }
    local_1f8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
  }
  local_200 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"Querying label length",0x15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  local_2ac = -1;
  (**(code **)(lVar4 + 0x958))(0x82e1,local_224,0,&local_2ac,0);
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 != 0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_210);
    uVar10 = 0xf;
    if (local_248 != local_238) {
      uVar10 = local_238[0];
    }
    if (uVar10 < local_268._M_string_length + local_240) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar11 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_268._M_string_length + local_240) goto LAB_013e9e1a;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
    }
    else {
LAB_013e9e1a:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268._M_dataplus._M_p)
      ;
    }
    local_2a8 = &local_298;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_298 = *plVar6;
      uStack_290 = puVar5[3];
    }
    else {
      local_298 = *plVar6;
      local_2a8 = (long *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1f0[0]._8_8_ = plVar6[3];
      local_200 = (undefined1  [8])local_1f0;
    }
    else {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_200 = (undefined1  [8])*plVar6;
    }
    local_1f8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
  }
  if (local_2ac == 0x15) {
    local_200 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Query returned length: ",0x17);
    std::ostream::operator<<((ostringstream *)&local_1f8,local_2ac);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,local_2ac);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x1c791ab);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
  }
  tcu::TestLog::endSection(local_220.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_200 = (undefined1  [8])local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Sync","");
  local_288._M_dataplus._M_p = (pointer)paVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"Sync object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_220,pTVar1,(string *)local_200,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar8) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
  }
  local_200 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"Querying label length",0x15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  local_2ac = -1;
  (**(code **)(lVar4 + 0x960))(local_218,0,&local_2ac,0);
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 != 0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_210);
    uVar10 = 0xf;
    if (local_248 != local_238) {
      uVar10 = local_238[0];
    }
    if (uVar10 < local_268._M_string_length + local_240) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar11 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_268._M_string_length + local_240) goto LAB_013ea2e9;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
    }
    else {
LAB_013ea2e9:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268._M_dataplus._M_p)
      ;
    }
    local_2a8 = &local_298;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_298 = *plVar6;
      uStack_290 = puVar5[3];
    }
    else {
      local_298 = *plVar6;
      local_2a8 = (long *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1f0[0]._8_8_ = plVar6[3];
      local_200 = (undefined1  [8])local_1f0;
    }
    else {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_200 = (undefined1  [8])*plVar6;
    }
    local_1f8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
  }
  if (local_2ac == 0) {
    local_200 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Query returned length: ",0x17);
    std::ostream::operator<<((ostringstream *)&local_1f8,local_2ac);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,local_2ac);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x1c792d4);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
  }
  local_200 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"Setting label to string: \"",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"This is a debug label",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,"\"",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  (**(code **)(lVar4 + 0xfc8))(local_218,0xffffffff,"This is a debug label");
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 != 0) {
    local_248 = local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Got Error ","");
    local_210 = glu::getErrorName;
    local_208 = iVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_210);
    uVar10 = 0xf;
    if (local_248 != local_238) {
      uVar10 = local_238[0];
    }
    if (uVar10 < local_268._M_string_length + local_240) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        uVar11 = local_268.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_268._M_string_length + local_240) goto LAB_013ea73f;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
    }
    else {
LAB_013ea73f:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268._M_dataplus._M_p)
      ;
    }
    local_2a8 = &local_298;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_298 = *plVar6;
      uStack_290 = puVar5[3];
    }
    else {
      local_298 = *plVar6;
      local_2a8 = (long *)*puVar5;
    }
    local_2a0 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1f0[0]._8_8_ = plVar6[3];
      local_200 = (undefined1  [8])local_1f0;
    }
    else {
      local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_200 = (undefined1  [8])*plVar6;
    }
    local_1f8 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if (local_200 != (undefined1  [8])local_1f0) {
      operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
  }
  local_200 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f8,"Querying label length",0x15);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  local_2ac = -1;
  (**(code **)(lVar4 + 0x960))(local_218,0,&local_2ac,0);
  iVar3 = (**(code **)(lVar4 + 0x800))();
  if (iVar3 == 0) goto LAB_013eabb2;
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Got Error ","");
  local_210 = glu::getErrorName;
  local_208 = iVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_210);
  uVar10 = 0xf;
  if (local_248 != local_238) {
    uVar10 = local_238[0];
  }
  if (uVar10 < local_268._M_string_length + local_240) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      uVar11 = local_268.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_268._M_string_length + local_240) goto LAB_013eaa05;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
  }
  else {
LAB_013eaa05:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268._M_dataplus._M_p);
  }
  local_2a8 = &local_298;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_298 = *plVar6;
    uStack_290 = puVar5[3];
  }
  else {
    local_298 = *plVar6;
    local_2a8 = (long *)*puVar5;
  }
  local_2a0 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2a8);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_288.field_2._M_allocated_capacity = *psVar7;
    local_288.field_2._8_8_ = plVar6[3];
    local_288._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_288.field_2._M_allocated_capacity = *psVar7;
    local_288._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_288._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_288);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar9) {
    local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_1f0[0]._8_8_ = plVar6[3];
    local_200 = (undefined1  [8])local_1f0;
  }
  else {
    local_1f0[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_200 = (undefined1  [8])*plVar6;
  }
  local_1f8 = (_func_int **)plVar6[1];
  *plVar6 = (long)paVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::ResultCollector::fail(&local_80,(string *)local_200);
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != paVar8) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
LAB_013eabb2:
  if (local_2ac == 0x15) {
    local_200 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Query returned length: ",0x17);
    std::ostream::operator<<((ostringstream *)&local_1f8,local_2ac);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    std::ios_base::~ios_base(local_188);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    std::ostream::operator<<(local_200,local_2ac);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
    std::ios_base::~ios_base(local_190);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,0x1c791ab);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288.field_2._8_8_ = plVar6[3];
      local_288._M_dataplus._M_p = (pointer)paVar8;
    }
    else {
      local_288.field_2._M_allocated_capacity = *psVar7;
      local_288._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_288._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::ResultCollector::fail(&local_80,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != paVar8) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
  }
  tcu::TestLog::endSection(local_220.m_log);
  (**(code **)(lVar4 + 0x470))(local_224);
  (**(code **)(lVar4 + 0x478))(local_218);
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

LabelLengthCase::IterateResult LabelLengthCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 0)
			result.fail("'length' was not 0, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectLabel(GL_SHADER, shader, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectLabel(GL_SHADER, shader, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

		if (outlen != 21)
			result.fail("'length' was not 21, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 0)
			result.fail("'length' was not 0, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
		gl.objectPtrLabel(sync, -1, msg);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

		m_testCtx.getLog() << TestLog::Message << "Querying label length" << TestLog::EndMessage;
		outlen = -1;
		gl.getObjectPtrLabel(sync, 0, &outlen, DE_NULL);
		GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

		if (outlen != 21)
			result.fail("'length' was not 21, got " + de::toString(outlen));
		else
			m_testCtx.getLog() << TestLog::Message << "Query returned length: " << outlen << TestLog::EndMessage;
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}